

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

void qt_fusion_draw_mdibutton
               (QPainter *painter,QStyleOptionTitleBar *option,QRect *tmp,bool hover,bool sunken)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long *plVar15;
  long lVar16;
  undefined8 *puVar17;
  ColorGroup CVar18;
  QGradient *pQVar19;
  undefined7 in_register_00000081;
  long in_FS_OFFSET;
  byte bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  QLinearGradient gradient;
  QBrush local_168 [8];
  QGradient local_160;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined4 local_f8;
  undefined8 local_f4;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined2 local_e4;
  undefined6 local_e2;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  int local_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  undefined8 local_80;
  int local_78;
  int iStack_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  bVar20 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = option->titleBarState;
  CVar18 = (int)option + 0x28;
  local_9c = 0xaaaaaaaa;
  QPalette::brush(CVar18,Dark);
  iVar12 = QColor::hue();
  QPalette::brush(CVar18,Dark);
  iVar13 = QColor::saturation();
  if (0xfe < iVar13) {
    iVar13 = 0xff;
  }
  QPalette::brush(CVar18,Dark);
  iVar14 = QColor::value();
  iVar11 = (int)((double)iVar14 * 0.7);
  if (0xfe < (int)((double)iVar14 * 0.7)) {
    iVar11 = 0xff;
  }
  auVar22 = QColor::fromHsv(iVar12,iVar13,iVar11,0xff);
  local_a8 = auVar22._0_8_;
  local_a0 = auVar22._8_4_;
  local_9c = CONCAT22(local_9c._2_2_,auVar22._12_2_);
  plVar15 = (long *)QPalette::brush(CVar18,Dark);
  local_b8 = *(undefined8 *)(*plVar15 + 8);
  uStack_b0 = *(undefined8 *)(*plVar15 + 0x10);
  local_c8 = 0xaaaaaaaa;
  uStack_c4 = 0xaaaaaaaa;
  uStack_c0 = 0xaaaaaaaa;
  uStack_bc = 0xaaaa;
  uStack_ba = 0xaaaa;
  if ((int)CONCAT71(in_register_00000081,sunken) == 0) {
    local_c8 = 1;
    uStack_c4 = 0xffff3c3c;
    uStack_c0 = 0xffffffff;
    uStack_bc = 0;
  }
  else {
    auVar22 = QColor::darker((int)&local_b8);
    local_c8 = auVar22._0_4_;
    uStack_c4 = auVar22._4_4_;
    uStack_c0 = auVar22._8_4_;
    uStack_bc = auVar22._12_2_;
  }
  local_cc = 0xaaaaaaaa;
  if ((uVar10 >> 0x10 & 1) == 0) {
    iVar12 = (int)&local_a8;
  }
  else {
    iVar12 = (int)&local_b8;
  }
  auVar22 = QColor::darker(iVar12);
  local_d8 = auVar22._0_8_;
  local_d0 = auVar22._8_4_;
  local_cc = CONCAT22(local_cc._2_2_,auVar22._12_2_);
  if (sunken) {
    local_160.m_type = (tmp->x1).m_i + RadialGradient;
    local_160.m_spread = (tmp->y1).m_i + ReflectSpread;
    local_160.m_stops.d.d = (Data *)CONCAT44((tmp->y2).m_i + -1,(tmp->x2).m_i + -1);
    auVar22 = QColor::darker((int)&local_b8);
    local_78 = auVar22._0_4_;
    iStack_74 = auVar22._4_4_;
    local_70 = auVar22._8_4_;
    local_6c = CONCAT22(local_6c._2_2_,auVar22._12_2_);
  }
  else {
    if (!hover) goto LAB_003b9ef7;
    local_160.m_type = (tmp->x1).m_i + RadialGradient;
    local_160.m_spread = (tmp->y1).m_i + ReflectSpread;
    local_160.m_stops.d.d = (Data *)CONCAT44((tmp->y2).m_i + -1,(tmp->x2).m_i + -1);
    local_78 = 1;
    iStack_74 = 0xffff1414;
    local_70 = 0xffffffff;
    local_6c = local_6c & 0xffff0000;
  }
  QPainter::fillRect((QRect *)painter,(QColor *)&local_160);
LAB_003b9ef7:
  uStack_da = 0xaaaa;
  local_e8 = 1;
  local_e4 = 0x2828;
  local_e2 = 0;
  uStack_dc = 0;
  local_f8 = 1;
  local_f4 = 0xffffffffffff3c3c;
  local_ec = 0xaaaa0000;
  puVar17 = &DAT_006d01e0;
  pQVar19 = &local_160;
  for (lVar16 = 0xb; lVar16 != 0; lVar16 = lVar16 + -1) {
    uVar9 = *puVar17;
    pQVar19->m_type = (int)uVar9;
    pQVar19->m_spread = (int)((ulong)uVar9 >> 0x20);
    puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
    pQVar19 = (QGradient *)((long)pQVar19 + (ulong)bVar20 * -0x10 + 8);
  }
  lVar16 = (long)(tmp->x2).m_i + (long)(tmp->x1).m_i;
  dVar21 = (double)(int)((ulong)(lVar16 - (lVar16 >> 0x3f)) >> 1);
  QLinearGradient::QLinearGradient
            ((QLinearGradient *)&local_160,dVar21,(double)(tmp->y1).m_i,dVar21,(double)(tmp->y2).m_i
            );
  QGradient::setColorAt(0.0,(QColor *)&local_160);
  QGradient::setColorAt(1.0,(QColor *)&local_160);
  QPainter::setPen((QColor *)painter);
  local_58 = (tmp->x1).m_i;
  iStack_74 = (tmp->y1).m_i;
  local_78 = local_58 + 2;
  local_48 = (tmp->x2).m_i;
  local_70 = local_48 + -2;
  local_64 = (tmp->y2).m_i;
  local_54 = iStack_74 + 2;
  local_4c = local_64 + -2;
  local_6c = iStack_74;
  local_68 = local_78;
  local_60 = local_70;
  local_5c = local_64;
  local_50 = local_58;
  local_44 = local_54;
  local_40 = local_48;
  local_3c = local_4c;
  QPainter::drawLines((QLine *)painter,(int)&local_78);
  iStack_88 = (tmp->x1).m_i + 1;
  iStack_8c = (tmp->y1).m_i + 1;
  local_98 = CONCAT44(iStack_8c,iStack_88);
  local_90 = (tmp->x2).m_i + -1;
  iStack_84 = (tmp->y2).m_i + -1;
  local_80 = CONCAT44(iStack_84,local_90);
  QPainter::drawPoints((QPoint *)painter,(int)&local_98);
  QPainter::setPen((QColor *)painter);
  uVar1 = tmp->y1;
  uVar5 = tmp->x2;
  local_108 = (tmp->x1).m_i + 2;
  iStack_104 = uVar1 + 1;
  iStack_100 = uVar5 + -2;
  iStack_fc = uVar1 + 1;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  uVar2 = tmp->x1;
  uVar6 = tmp->y1;
  local_108 = uVar2 + 1;
  iStack_104 = uVar6 + 2;
  iStack_fc = (tmp->y2).m_i + -2;
  iStack_100 = local_108;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  QBrush::QBrush(local_168,&local_160);
  QPen::QPen((QPen *)&local_108,local_168,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)painter);
  QPen::~QPen((QPen *)&local_108);
  QBrush::~QBrush(local_168);
  iStack_fc = (tmp->y2).m_i + -2;
  uVar3 = tmp->y1;
  uVar7 = tmp->x2;
  iStack_104 = uVar3 + 2;
  local_108 = uVar7 + 1;
  iStack_100 = local_108;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  local_108 = (tmp->x2).m_i;
  iStack_104 = (tmp->y1).m_i + 1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  local_108 = (tmp->x1).m_i + 2;
  uVar4 = tmp->x2;
  uVar8 = tmp->y2;
  iStack_100 = uVar4 + -2;
  iStack_104 = uVar8 + 1;
  iStack_fc = iStack_104;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  iStack_104 = (tmp->y2).m_i;
  local_108 = (tmp->x1).m_i + 1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  iStack_104 = (tmp->y2).m_i;
  local_108 = (tmp->x2).m_i + -1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  local_108 = (tmp->x2).m_i;
  iStack_104 = (tmp->y2).m_i + -1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  QLinearGradient::~QLinearGradient((QLinearGradient *)&local_160);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_fusion_draw_mdibutton(QPainter *painter, const QStyleOptionTitleBar *option, const QRect &tmp, bool hover, bool sunken)
{
    bool active = (option->titleBarState & QStyle::State_Active);
    const QColor dark = QColor::fromHsv(option->palette.button().color().hue(),
                                        qMin(255, option->palette.button().color().saturation()),
                                        qMin(255, int(option->palette.button().color().value() * 0.7)));
    const QColor highlight = option->palette.highlight().color();
    const QColor titleBarHighlight(sunken ? highlight.darker(130) : QColor(255, 255, 255, 60));
    const QColor mdiButtonBorderColor(active ? highlight.darker(180): dark.darker(110));

    if (sunken)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), highlight.darker(120));
    else if (hover)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), QColor(255, 255, 255, 20));

    const QColor mdiButtonGradientStartColor(0, 0, 0, 40);
    const QColor mdiButtonGradientStopColor(255, 255, 255, 60);

    QLinearGradient gradient(tmp.center().x(), tmp.top(), tmp.center().x(), tmp.bottom());
    gradient.setColorAt(0, mdiButtonGradientStartColor);
    gradient.setColorAt(1, mdiButtonGradientStopColor);

    painter->setPen(mdiButtonBorderColor);
    const QLine lines[4] = {
        QLine(tmp.left() + 2, tmp.top(), tmp.right() - 2, tmp.top()),
        QLine(tmp.left() + 2, tmp.bottom(), tmp.right() - 2, tmp.bottom()),
        QLine(tmp.left(), tmp.top() + 2, tmp.left(), tmp.bottom() - 2),
        QLine(tmp.right(), tmp.top() + 2, tmp.right(), tmp.bottom() - 2)
    };
    painter->drawLines(lines, 4);
    const QPoint points[4] = {
        QPoint(tmp.left() + 1, tmp.top() + 1),
        QPoint(tmp.right() - 1, tmp.top() + 1),
        QPoint(tmp.left() + 1, tmp.bottom() - 1),
        QPoint(tmp.right() - 1, tmp.bottom() - 1)
    };
    painter->drawPoints(points, 4);

    painter->setPen(titleBarHighlight);
    painter->drawLine(tmp.left() + 2, tmp.top() + 1, tmp.right() - 2, tmp.top() + 1);
    painter->drawLine(tmp.left() + 1, tmp.top() + 2, tmp.left() + 1, tmp.bottom() - 2);

    painter->setPen(QPen(gradient, 1));
    painter->drawLine(tmp.right() + 1, tmp.top() + 2, tmp.right() + 1, tmp.bottom() - 2);
    painter->drawPoint(tmp.right() , tmp.top() + 1);

    painter->drawLine(tmp.left() + 2, tmp.bottom() + 1, tmp.right() - 2, tmp.bottom() + 1);
    painter->drawPoint(tmp.left() + 1, tmp.bottom());
    painter->drawPoint(tmp.right() - 1, tmp.bottom());
    painter->drawPoint(tmp.right() , tmp.bottom() - 1);
}